

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_pressure.h
# Opt level: O3

RegisterLiveness * __thiscall
spvtools::opt::LivenessAnalysis::Get(LivenessAnalysis *this,Function *f)

{
  _Node_iterator_base<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::RegisterLiveness>,_false>
  _Var1;
  Function *local_68;
  RegisterLiveness local_60;
  
  local_68 = f;
  _Var1._M_cur = (__node_type *)
                 std::
                 _Hashtable<const_spvtools::opt::Function_*,_std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::RegisterLiveness>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::RegisterLiveness>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::Function_*>,_std::hash<const_spvtools::opt::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->analysis_cache_)._M_h,&local_68);
  if (_Var1._M_cur == (__node_type *)0x0) {
    local_60.context_ = this->context_;
    local_60.block_pressure_._M_h._M_buckets = &local_60.block_pressure_._M_h._M_single_bucket;
    local_60.block_pressure_._M_h._M_bucket_count = 1;
    local_60.block_pressure_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_60.block_pressure_._M_h._M_element_count = 0;
    local_60.block_pressure_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_60.block_pressure_._M_h._M_rehash_policy._M_next_resize = 0;
    local_60.block_pressure_._M_h._M_single_bucket = (__node_base_ptr)0x0;
    RegisterLiveness::Analyze(&local_60,local_68);
    _Var1._M_cur = (__node_type *)
                   std::
                   _Hashtable<spvtools::opt::Function_const*,std::pair<spvtools::opt::Function_const*const,spvtools::opt::RegisterLiveness>,std::allocator<std::pair<spvtools::opt::Function_const*const,spvtools::opt::RegisterLiveness>>,std::__detail::_Select1st,std::equal_to<spvtools::opt::Function_const*>,std::hash<spvtools::opt::Function_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                   ::_M_emplace<spvtools::opt::Function*&,spvtools::opt::RegisterLiveness>
                             (&this->analysis_cache_,&local_68,&local_60);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_60.block_pressure_._M_h);
  }
  return (RegisterLiveness *)
         ((long)&((_Var1._M_cur)->
                 super__Hash_node_value<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::RegisterLiveness>,_false>
                 ).
                 super__Hash_node_value_base<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::RegisterLiveness>_>
                 ._M_storage._M_storage + 8);
}

Assistant:

const RegisterLiveness* Get(Function* f) {
    LivenessAnalysisMap::iterator it = analysis_cache_.find(f);
    if (it != analysis_cache_.end()) {
      return &it->second;
    }
    return &analysis_cache_.emplace(f, RegisterLiveness{context_, f})
                .first->second;
  }